

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-pickup.c
# Opt level: O3

void do_cmd_pickup(command *cmd)

{
  byte *pbVar1;
  ushort uVar2;
  player_upkeep *ppVar3;
  byte bVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  object *obj;
  object *local_18;
  
  local_18 = (object *)0x0;
  cmd_get_arg_item((command_conflict *)cmd,"item",&local_18);
  bVar4 = player_pickup_item(player,local_18,false);
  uVar2 = z_info->move_energy;
  wVar5 = ((uint)bVar4 * (uint)uVar2) / 10;
  wVar6 = (uint)uVar2;
  if ((uint)wVar5 < (uint)uVar2) {
    wVar6 = wVar5;
  }
  ppVar3 = player->upkeep;
  ppVar3->energy_use = wVar6;
  pbVar1 = (byte *)((long)&ppVar3->redraw + 2);
  *pbVar1 = *pbVar1 | 0x80;
  return;
}

Assistant:

void do_cmd_pickup(struct command *cmd)
{
	int energy_cost = 0;
	struct object *obj = NULL;

	/* See if we have an item already */
	(void) cmd_get_arg_item(cmd, "item", &obj);

	/* Pick up floor objects with a menu for multiple objects */
	energy_cost += player_pickup_item(player, obj, false)
		* z_info->move_energy / 10;

	/* Limit */
	if (energy_cost > z_info->move_energy) energy_cost = z_info->move_energy;

	/* Charge this amount of energy. */
	player->upkeep->energy_use = energy_cost;

	/* Redraw the object list using the upkeep flag so that the update can be
	 * somewhat coalesced. Use event_signal(EVENT_ITEMLIST to force update. */
	player->upkeep->redraw |= (PR_ITEMLIST);
}